

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prediction_scheme_wrap_decoding_transform.h
# Opt level: O0

bool __thiscall
draco::PredictionSchemeWrapDecodingTransform<int,_int>::DecodeTransformData
          (PredictionSchemeWrapDecodingTransform<int,_int> *this,DecoderBuffer *buffer)

{
  bool bVar1;
  DecoderBuffer *in_RSI;
  PredictionSchemeWrapTransformBase<int> *in_RDI;
  int max_value;
  int min_value;
  int in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  bool local_1;
  
  bVar1 = DecoderBuffer::Decode<int>
                    (in_RSI,(int *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  if (bVar1) {
    bVar1 = DecoderBuffer::Decode<int>
                      (in_RSI,(int *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    if (bVar1) {
      if (in_stack_ffffffffffffffe0 < in_stack_ffffffffffffffe4) {
        local_1 = false;
      }
      else {
        PredictionSchemeWrapTransformBase<int>::set_min_value
                  (in_RDI,(int *)&stack0xffffffffffffffe4);
        PredictionSchemeWrapTransformBase<int>::set_max_value
                  (in_RDI,(int *)&stack0xffffffffffffffe0);
        bVar1 = PredictionSchemeWrapTransformBase<int>::InitCorrectionBounds
                          ((PredictionSchemeWrapTransformBase<int> *)in_RSI);
        if (bVar1) {
          local_1 = true;
        }
        else {
          local_1 = false;
        }
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool DecodeTransformData(DecoderBuffer *buffer) {
    DataTypeT min_value, max_value;
    if (!buffer->Decode(&min_value)) {
      return false;
    }
    if (!buffer->Decode(&max_value)) {
      return false;
    }
    if (min_value > max_value) {
      return false;
    }
    this->set_min_value(min_value);
    this->set_max_value(max_value);
    if (!this->InitCorrectionBounds()) {
      return false;
    }
    return true;
  }